

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResupplyOfferPdu.cpp
# Opt level: O3

int __thiscall DIS::ResupplyOfferPdu::getMarshalledSize(ResupplyOfferPdu *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pSVar4;
  ulong uVar5;
  long lVar6;
  SupplyQuantity listElement;
  SupplyQuantity local_50;
  
  iVar1 = LogisticsFamilyPdu::getMarshalledSize(&this->super_LogisticsFamilyPdu);
  iVar2 = EntityID::getMarshalledSize(&this->_receivingEntityID);
  iVar3 = EntityID::getMarshalledSize(&this->_supplyingEntityID);
  iVar1 = iVar3 + iVar2 + iVar1 + 4;
  pSVar4 = (this->_supplies).
           super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_supplies).
      super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>._M_impl.
      super__Vector_impl_data._M_finish != pSVar4) {
    lVar6 = 0x18;
    uVar5 = 0;
    do {
      local_50._vptr_SupplyQuantity = (_func_int **)&PTR__SupplyQuantity_001a14d0;
      local_50._supplyType._vptr_EntityType = (_func_int **)&PTR__EntityType_0019fe40;
      local_50._supplyType._8_8_ = *(undefined8 *)((long)pSVar4 + lVar6 + -8);
      local_50._quantity = *(uchar *)((long)&pSVar4->_vptr_SupplyQuantity + lVar6);
      iVar2 = SupplyQuantity::getMarshalledSize(&local_50);
      iVar1 = iVar1 + iVar2;
      SupplyQuantity::~SupplyQuantity(&local_50);
      uVar5 = uVar5 + 1;
      pSVar4 = (this->_supplies).
               super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>._M_impl
               .super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x20;
    } while (uVar5 < (ulong)((long)(this->_supplies).
                                   super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4 >> 5));
  }
  return iVar1;
}

Assistant:

int ResupplyOfferPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = LogisticsFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _receivingEntityID.getMarshalledSize();  // _receivingEntityID
   marshalSize = marshalSize + _supplyingEntityID.getMarshalledSize();  // _supplyingEntityID
   marshalSize = marshalSize + 1;  // _numberOfSupplyTypes
   marshalSize = marshalSize + 2;  // _padding1
   marshalSize = marshalSize + 1;  // _padding2

   for(unsigned long long idx=0; idx < _supplies.size(); idx++)
   {
        SupplyQuantity listElement = _supplies[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}